

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::detail::ReferenceResolver::resolve(ReferenceResolver *this)

{
  size_t sVar1;
  refdata *prVar2;
  code *pcVar3;
  bool bVar4;
  ulong uVar5;
  size_t sVar6;
  long lVar7;
  size_t i;
  ulong uVar8;
  
  store_anchors_and_refs(this);
  sVar1 = (this->refs).m_size;
  if (sVar1 != 0) {
    lVar7 = -0x30;
    for (uVar8 = 0; sVar1 != uVar8; uVar8 = uVar8 + 1) {
      uVar5 = (this->refs).m_size;
      if (uVar5 <= uVar8) {
        if (((byte)s_error_flags & 1) != 0) {
          bVar4 = is_debugger_attached();
          if (bVar4) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
        }
        to_csubstr(
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                  );
        (*(code *)PTR_error_impl_0022e4f8)
                  ("check failed: i < m_size",0x18,(anonymous_namespace)::s_default_callbacks);
        uVar5 = (this->refs).m_size;
      }
      prVar2 = (this->refs).m_stack;
      if ((*(byte *)((long)&prVar2[uVar5].type.type + lVar7) & 0xc0) != 0) {
        sVar6 = lookup_(this,(refdata *)((long)&prVar2[uVar5].type.type + lVar7));
        *(size_t *)((long)&prVar2[uVar5].target + lVar7) = sVar6;
      }
      lVar7 = lVar7 + -0x30;
    }
  }
  return;
}

Assistant:

void resolve()
    {
        store_anchors_and_refs();
        if(refs.empty())
            return;

        /* from the specs: "an alias node refers to the most recent
         * node in the serialization having the specified anchor". So
         * we need to start looking upward from ref nodes.
         *
         * @see http://yaml.org/spec/1.2/spec.html#id2765878 */
        for(size_t i = 0, e = refs.size(); i < e; ++i)
        {
            auto &C4_RESTRICT rd = refs.top(i);
            if( ! rd.type.is_ref())
                continue;
            rd.target = lookup_(&rd);
        }
    }